

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaHash.c
# Opt level: O1

int Gia_ManHashAndMulti(Gia_Man_t *p,Vec_Int_t *vLits)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  
  if (vLits->nSize == 0) {
    iVar3 = 0;
  }
  else {
    iVar3 = vLits->nSize;
    while (1 < iVar3) {
      uVar2 = vLits->nSize;
      uVar4 = 0;
      if (1 < (int)uVar2) {
        iVar3 = 1;
        uVar4 = 0;
        do {
          iVar1 = Gia_ManHashAnd(p,vLits->pArray[uVar4 * 2],vLits->pArray[uVar4 * 2 + 1]);
          if ((long)vLits->nSize <= (long)uVar4) goto LAB_0020bced;
          vLits->pArray[uVar4] = iVar1;
          uVar4 = uVar4 + 1;
          uVar2 = vLits->nSize;
          iVar3 = iVar3 + 2;
        } while (iVar3 < (int)uVar2);
      }
      iVar3 = (int)uVar4;
      if ((uVar2 & 1) != 0) {
        if ((int)uVar2 < 1) {
          __assert_fail("p->nSize > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
        }
        if ((int)uVar2 <= iVar3) {
LAB_0020bced:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        iVar3 = iVar3 + 1;
        vLits->pArray[uVar4 & 0xffffffff] = vLits->pArray[(ulong)uVar2 - 1];
      }
      if (vLits->nSize < iVar3) {
        __assert_fail("p->nSize >= nSizeNew",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
      }
      vLits->nSize = iVar3;
    }
    if (iVar3 != 1) {
      __assert_fail("Vec_IntSize(vLits) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaHash.c"
                    ,799,"int Gia_ManHashAndMulti(Gia_Man_t *, Vec_Int_t *)");
    }
    iVar3 = *vLits->pArray;
  }
  return iVar3;
}

Assistant:

int Gia_ManHashAndMulti( Gia_Man_t * p, Vec_Int_t * vLits )
{
    if ( Vec_IntSize(vLits) == 0 )
        return 0;
    while ( Vec_IntSize(vLits) > 1 )
    {
        int i, k = 0, Lit1, Lit2, LitRes;
        Vec_IntForEachEntryDouble( vLits, Lit1, Lit2, i )
        {
            LitRes = Gia_ManHashAnd( p, Lit1, Lit2 );
            Vec_IntWriteEntry( vLits, k++, LitRes );
        }
        if ( Vec_IntSize(vLits) & 1 )
            Vec_IntWriteEntry( vLits, k++, Vec_IntEntryLast(vLits) );
        Vec_IntShrink( vLits, k );
    }
    assert( Vec_IntSize(vLits) == 1 );
    return Vec_IntEntry(vLits, 0);
}